

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

void __thiscall cmCPackGenerator::SetOption(cmCPackGenerator *this,string *op,char *value)

{
  cmCPackLog *this_00;
  long *msg;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  ostream *poVar3;
  ostringstream cmCPackLog_msg;
  undefined1 auStack_1c8 [8];
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  char *__s;
  
  if (value != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    iVar1 = (*(this->super_cmObject)._vptr_cmObject[2])(this);
    __s = (char *)CONCAT44(extraout_var,iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(auStack_1c8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)) + 0x28);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"::SetOption(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(op->_M_dataplus)._M_p,op->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    sVar2 = strlen(value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,value,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    this_00 = this->Logger;
    std::__cxx11::stringbuf::str();
    msg = local_1c0;
    sVar2 = strlen((char *)local_1c0);
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3f4,(char *)msg,sVar2);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    cmMakefile::AddDefinition(this->MakefileMap,op,value);
    return;
  }
  cmMakefile::RemoveDefinition(this->MakefileMap,op);
  return;
}

Assistant:

void cmCPackGenerator::SetOption(const std::string& op, const char* value)
{
  if ( !value )
    {
    this->MakefileMap->RemoveDefinition(op);
    return;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, this->GetNameOfClass()
    << "::SetOption(" << op << ", " << value << ")" << std::endl);
  this->MakefileMap->AddDefinition(op, value);
}